

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O2

void __thiscall SAT::varBumpActivity(SAT *this,Lit p)

{
  double *pdVar1;
  undefined4 in_EAX;
  uint uVar2;
  bool *pbVar3;
  byte bVar4;
  uint uVar5;
  int var_id;
  undefined8 uStack_28;
  
  bVar4 = (byte)p.x;
  uVar5 = p.x >> 1;
  uStack_28._0_4_ = in_EAX;
  if (so.vsids) {
    pdVar1 = (this->activity).data;
    pdVar1[uVar5] = this->var_inc + pdVar1[uVar5];
    if (((int)uVar5 < (int)(this->order_heap).indices.sz) &&
       (-1 < (this->order_heap).indices.data[uVar5])) {
      Heap<SAT::VarOrderLt>::decrease(&this->order_heap,uVar5);
    }
    if (so.sat_polarity == 2) {
      pbVar3 = (this->polarity).data;
    }
    else {
      if (so.sat_polarity != 1) goto LAB_0019e796;
      pbVar3 = (this->polarity).data;
      bVar4 = ~bVar4;
    }
    pbVar3[uVar5] = (bool)(bVar4 & 1);
  }
LAB_0019e796:
  uVar5 = *(uint *)((this->c_info).data + uVar5);
  if ((uVar5 & 0x60000000) == 0x20000000) {
    uVar2 = uVar5 & 0x1fffffff;
    uStack_28 = CONCAT44(uVar5,(undefined4)uStack_28) & 0x1fffffffffffffff;
    pbVar3 = (this->ivseen).data;
    if (pbVar3[uVar2] == false) {
      engine.vars.data[uVar2]->activity = this->var_inc + engine.vars.data[uVar2]->activity;
      pbVar3[uVar2] = true;
      vec<int>::push(&this->ivseen_toclear,(int *)((long)&uStack_28 + 4));
    }
  }
  return;
}

Assistant:

inline void SAT::varBumpActivity(Lit p) {
	const int v = var(p);
	if (so.vsids) {
		activity[v] += var_inc;
		if (order_heap.inHeap(v)) {
			order_heap.decrease(v);
		}
		if (so.sat_polarity == 1) {
			polarity[v] = ((static_cast<int>(sign(p)) ^ 1) != 0);
		}
		if (so.sat_polarity == 2) {
			polarity[v] = sign(p);
		}
	}
	if (c_info[v].cons_type == 1) {
		const int var_id = c_info[v].cons_id;
		if (!ivseen[var_id]) {
			engine.vars[var_id]->activity += var_inc;
			ivseen[var_id] = true;
			ivseen_toclear.push(var_id);
		}
	}
}